

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

int xmlBufferResize(xmlBufferPtr buf,uint size)

{
  uint uVar1;
  
  if (buf != (xmlBufferPtr)0x0) {
    uVar1 = 1;
    if (buf->size <= size) {
      uVar1 = xmlBufferGrow(buf,size - buf->use);
      uVar1 = ~uVar1 >> 0x1f;
    }
    return uVar1;
  }
  return 0;
}

Assistant:

int
xmlBufferResize(xmlBufferPtr buf, unsigned int size)
{
    int res;

    if (buf == NULL)
        return(0);
    if (size < buf->size)
        return(1);
    res = xmlBufferGrow(buf, size - buf->use);

    return(res < 0 ? 0 : 1);
}